

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
copyChildNodesToNode
          (UA_Server *server,UA_Session *session,UA_NodeId *sourceNodeId,
          UA_NodeId *destinationNodeId,UA_InstantiationCallback *instantiationCallback)

{
  int iVar1;
  UA_ReferenceNode *pUVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined4 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined4 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined4 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  undefined4 uVar14;
  UA_NodeId UVar15;
  UA_NodeId UVar16;
  UA_NodeId *pUVar17;
  UA_InstantiationCallback *pUVar18;
  UA_Session *session_00;
  UA_Boolean UVar19;
  UA_StatusCode UVar20;
  UA_Node *pUVar21;
  UA_Byte *pUVar22;
  UA_VariableNode *vn;
  UA_Node *pUVar23;
  undefined8 *puVar24;
  UA_DataValue *p;
  UA_Server *server_00;
  size_t sVar25;
  long lVar26;
  undefined8 uVar27;
  UA_String *s1;
  bool bVar28;
  UA_BrowseDescription local_358;
  undefined1 auStack_308 [8];
  UA_BrowseResult br;
  UA_UInt16 UStack_2d8;
  undefined2 uStack_2d6;
  UA_NodeIdType UStack_2d4;
  UA_NodeId mandatoryId;
  undefined1 auStack_1d8 [8];
  UA_NodeId id_1;
  undefined1 auStack_108 [8];
  UA_DataValue value;
  UA_NodeId UStack_a0;
  UA_Byte *local_88;
  UA_NodeId *local_80;
  UA_NodeId local_78;
  undefined8 *local_58;
  UA_Server *local_50;
  UA_InstantiationCallback *local_48;
  UA_NodeId *local_40;
  UA_Session *local_38;
  
  local_358._68_4_ = 0;
  local_358.referenceTypeId.identifier.string.length._4_4_ = 0;
  local_358.referenceTypeId.identifier.string.data = (UA_Byte *)0x0;
  local_358.referenceTypeId._2_2_ = 0;
  local_358.nodeId.namespaceIndex = sourceNodeId->namespaceIndex;
  local_358.nodeId._2_2_ = *(undefined2 *)&sourceNodeId->field_0x2;
  local_358.nodeId.identifierType = sourceNodeId->identifierType;
  local_358.nodeId.identifier.string.length = (sourceNodeId->identifier).string.length;
  local_358.nodeId.identifier.string.data = (sourceNodeId->identifier).string.data;
  local_358.referenceTypeId.namespaceIndex = 0;
  local_358.referenceTypeId.identifierType = UA_NODEIDTYPE_NUMERIC;
  local_358.referenceTypeId.identifier.numeric = 0x2c;
  local_358.includeSubtypes = true;
  local_358._57_3_ = 0;
  local_358.browseDirection = UA_BROWSEDIRECTION_FORWARD;
  local_358._28_4_ = 0;
  local_358.nodeClassMask = 7;
  local_358.resultMask = 0xd;
  br.continuationPoint.length = 0;
  br.continuationPoint.data = (UA_Byte *)0x0;
  auStack_308 = (undefined1  [8])0x0;
  br.statusCode = 0;
  br._4_4_ = 0;
  br.referencesSize = 0;
  local_48 = instantiationCallback;
  Service_Browse_single
            (server,session,(ContinuationPointEntry *)0x0,&local_358,0,
             (UA_BrowseResult *)auStack_308);
  UVar20 = auStack_308._0_4_;
  if (auStack_308._0_4_ == 0) {
    local_78.namespaceIndex = 0;
    local_78._2_2_ = 0;
    local_78.identifierType = 0;
    local_78.identifier.string.length = 0;
    local_78.identifier.string.data = (UA_Byte *)0x0;
    local_58 = (undefined8 *)&stack0xfffffffffffffdf0;
    pUVar22 = (UA_Byte *)0x0;
    local_50 = server;
    local_40 = destinationNodeId;
    local_38 = session;
LAB_001275d5:
    sVar25 = br.referencesSize;
    if (pUVar22 < br.continuationPoint.data) {
      UStack_2d8 = 0;
      auStack_1d8._0_2_ = 0;
      local_80 = (UA_NodeId *)(br.referencesSize + (long)pUVar22 * 0xc0 + 0x20);
      UStack_2d4 = UA_NODEIDTYPE_NUMERIC;
      mandatoryId.namespaceIndex = 0x4e;
      mandatoryId._2_2_ = 0;
      auStack_1d8._4_4_ = UA_NODEIDTYPE_NUMERIC;
      id_1.namespaceIndex = 0x25;
      id_1._2_2_ = 0;
      local_88 = pUVar22;
      pUVar21 = UA_NodeStore_get(server->nodestore,local_80);
      server = local_50;
      if (pUVar21 != (UA_Node *)0x0) {
        puVar24 = (undefined8 *)(sVar25 + (long)pUVar22 * 0xc0);
        sVar25 = pUVar21->referencesSize;
        lVar26 = 0x20;
        while (bVar28 = sVar25 != 0, sVar25 = sVar25 - 1, server = local_50, bVar28) {
          pUVar2 = pUVar21->references;
          UVar19 = UA_NodeId_equal((UA_NodeId *)auStack_1d8,
                                   (UA_NodeId *)((long)pUVar2 + lVar26 + -0x20));
          if (((UVar19) &&
              (UVar19 = UA_NodeId_equal((UA_NodeId *)&stack0xfffffffffffffd28,
                                        (UA_NodeId *)
                                        ((long)&(pUVar2->referenceTypeId).namespaceIndex + lVar26)),
              UVar19)) && (*(char *)((long)pUVar2 + lVar26 + -8) != '\x01')) {
            mandatoryId.identifier.string.data = (UA_Byte *)0x0;
            mandatoryId.identifier.string.length = (size_t)(local_40->identifier).string.data;
            uVar3 = local_40->namespaceIndex;
            uVar4 = *(undefined2 *)&local_40->field_0x2;
            uVar5 = local_40->identifierType;
            sVar25 = (local_40->identifier).string.length;
            mandatoryId._0_4_ = SUB84(sVar25,0);
            mandatoryId.identifierType = (UA_NodeIdType)(sVar25 >> 0x20);
            id_1.identifier.string.length = 0;
            id_1.identifier.string.data = (UA_Byte *)0x0;
            auStack_1d8._0_2_ = 0;
            auStack_1d8._2_2_ = 0;
            auStack_1d8._4_4_ = UA_NODEIDTYPE_NUMERIC;
            id_1.namespaceIndex = 0;
            id_1._2_2_ = 0;
            id_1.identifierType = UA_NODEIDTYPE_NUMERIC;
            UStack_2d8 = uVar3;
            uStack_2d6 = uVar4;
            UStack_2d4 = uVar5;
            Service_Browse_single
                      (local_50,local_38,(ContinuationPointEntry *)0x0,
                       (UA_BrowseDescription *)&stack0xfffffffffffffd28,0,
                       (UA_BrowseResult *)auStack_1d8);
            UVar20 = CONCAT22(auStack_1d8._2_2_,auStack_1d8._0_2_);
            if (UVar20 != 0) goto LAB_00127dcc;
            s1 = (UA_String *)0x58;
            uVar27 = id_1.identifier.string.data;
            goto LAB_0012775c;
          }
          lVar26 = lVar26 + 0x50;
        }
      }
      goto LAB_0012769d;
    }
    UVar20 = 0;
LAB_00127dcc:
    UA_BrowseResult_deleteMembers((UA_BrowseResult *)auStack_308);
  }
  return UVar20;
LAB_0012775c:
  bVar28 = (UA_Byte *)uVar27 == (UA_Byte *)0x0;
  uVar27 = uVar27 + -1;
  if (bVar28) goto LAB_00127785;
  if ((*(short *)&s1[-1].data == *(short *)(puVar24 + 10)) &&
     (UVar19 = UA_String_equal(s1,(UA_String *)(puVar24 + 0xb)), UVar19)) {
    UVar20 = UA_NodeId_copy((UA_NodeId *)&s1[-4].data,&local_78);
    goto LAB_0012779d;
  }
  s1 = s1 + 0xc;
  goto LAB_0012775c;
LAB_00127785:
  UVar20 = 0;
LAB_0012779d:
  UA_BrowseResult_deleteMembers((UA_BrowseResult *)auStack_1d8);
  server = local_50;
  pUVar17 = local_80;
  if (UVar20 != 0) goto LAB_00127dcc;
  UVar19 = UA_NodeId_equal(&UA_NODEID_NULL,&local_78);
  iVar1 = *(int *)(puVar24 + 0x11);
  if (UVar19) {
    if (iVar1 == 1) {
      pUVar21 = UA_NodeStore_get(server->nodestore,pUVar17);
      pUVar17 = local_40;
      if (pUVar21 == (UA_Node *)0x0) {
        UVar20 = 0x80330000;
        goto LAB_00127dcc;
      }
      if (pUVar21->nodeClass != UA_NODECLASS_OBJECT) {
        UVar20 = 0x805f0000;
        goto LAB_00127dcc;
      }
      auStack_1d8._0_2_ = 0;
      auStack_1d8._2_2_ = 0;
      auStack_1d8._4_4_ = UA_NODEIDTYPE_NUMERIC;
      sVar25 = (pUVar21->displayName).locale.length;
      id_1.identifier.string.length = (size_t)(pUVar21->displayName).locale.data;
      id_1.identifier.string.data = (UA_Byte *)(pUVar21->displayName).text.length;
      id_1._0_4_ = SUB84(sVar25,0);
      id_1.identifierType = (UA_NodeIdType)(sVar25 >> 0x20);
      memset((void *)((long)&mandatoryId.identifier + 8),0,0xe0);
      mandatoryId.identifier.string.length = (size_t)(pUVar17->identifier).string.data;
      uVar12 = pUVar17->namespaceIndex;
      uVar13 = *(undefined2 *)&pUVar17->field_0x2;
      uVar14 = pUVar17->identifierType;
      sVar25 = (pUVar17->identifier).string.length;
      mandatoryId._0_4_ = SUB84(sVar25,0);
      mandatoryId.identifierType = (UA_NodeIdType)(sVar25 >> 0x20);
      UStack_2d8 = uVar12;
      uStack_2d6 = uVar13;
      UStack_2d4 = uVar14;
      pUVar23 = getNodeType(server,pUVar21);
      session_00 = local_38;
      puVar24 = local_58;
      UVar20 = 0x80630000;
      if (((pUVar23 != (UA_Node *)0x0) && (pUVar23->nodeClass == UA_NODECLASS_OBJECTTYPE)) &&
         ((char)pUVar23[1].nodeId.namespaceIndex == '\0')) {
        local_58[2] = (pUVar23->nodeId).identifier.string.data;
        sVar25 = (pUVar23->nodeId).identifier.string.length;
        *puVar24 = *(undefined8 *)&pUVar23->nodeId;
        puVar24[1] = sVar25;
        pUVar18 = local_48;
        value.value.type = (UA_DataType *)0x0;
        value.value.storageType = UA_VARIANT_DATA;
        value.value._12_4_ = 0;
        auStack_108 = (undefined1  [8])0x0;
        value._0_8_ = 0;
        Service_AddNodes_single
                  (server,session_00,(UA_AddNodesItem *)&stack0xfffffffffffffd28,
                   (UA_AddNodesResult *)auStack_108,local_48);
        UVar20 = auStack_108._0_4_;
        if (auStack_108._0_4_ == 0) {
          UVar20 = copyChildNodesToNode
                             (server,local_38,&pUVar21->nodeId,(UA_NodeId *)&value,pUVar18);
          if ((pUVar18 != (UA_InstantiationCallback *)0x0) && (UVar20 == 0)) {
            UVar16.identifier.string.length = (size_t)value.value.type;
            UVar16.namespaceIndex = value._0_2_;
            UVar16._2_2_ = value._2_2_;
            UVar16.identifierType = value._4_4_;
            UVar16.identifier.string.data = (UA_Byte *)value.value._8_8_;
            (*pUVar18->method)(UVar16,pUVar21->nodeId,pUVar18->handle);
          }
          p = &value;
          goto LAB_001278c0;
        }
      }
    }
    else if (iVar1 == 2) {
      server_00 = (UA_Server *)server->nodestore;
      vn = (UA_VariableNode *)UA_NodeStore_get((UA_NodeStore *)server_00,pUVar17);
      if (vn == (UA_VariableNode *)0x0) {
        UVar20 = 0x80330000;
      }
      else {
        UVar20 = 0x805f0000;
        if (vn->nodeClass == UA_NODECLASS_VARIABLE) {
          value.sourcePicoseconds = 0;
          value._74_6_ = 0;
          value.serverTimestamp = 0;
          value.status = 0;
          value._60_4_ = 0;
          value.sourceTimestamp = 0;
          value.value.arrayDimensionsSize = 0;
          value.value.arrayDimensions = (UA_UInt32 *)0x0;
          value.value.arrayLength = 0;
          value.value.data = (void *)0x0;
          value.value.type = (UA_DataType *)0x0;
          value.value.storageType = UA_VARIANT_DATA;
          value.value._12_4_ = 0;
          auStack_108 = (undefined1  [8])0x0;
          value._0_8_ = 0;
          UVar20 = readValueAttribute(server_00,vn,(UA_DataValue *)auStack_108);
          if (UVar20 == 0) {
            memset(auStack_1d8,0,200);
            sVar25 = (vn->displayName).locale.length;
            id_1.identifier.string.length = (size_t)(vn->displayName).locale.data;
            id_1.identifier.string.data = (UA_Byte *)(vn->displayName).text.length;
            id_1._0_4_ = SUB84(sVar25,0);
            id_1.identifierType = (UA_NodeIdType)(sVar25 >> 0x20);
            memset((void *)((long)&mandatoryId.identifier + 8),0,0xe0);
            mandatoryId.identifier.string.length = (size_t)(local_40->identifier).string.data;
            uVar9 = local_40->namespaceIndex;
            uVar10 = *(undefined2 *)&local_40->field_0x2;
            uVar11 = local_40->identifierType;
            sVar25 = (local_40->identifier).string.length;
            mandatoryId._0_4_ = SUB84(sVar25,0);
            mandatoryId.identifierType = (UA_NodeIdType)(sVar25 >> 0x20);
            UStack_2d8 = uVar9;
            uStack_2d6 = uVar10;
            UStack_2d4 = uVar11;
            pUVar21 = getNodeType(server,(UA_Node *)vn);
            pUVar18 = local_48;
            puVar24 = local_58;
            UVar20 = 0x80630000;
            if (((pUVar21 != (UA_Node *)0x0) && (pUVar21->nodeClass == UA_NODECLASS_VARIABLETYPE))
               && ((char)pUVar21[2].browseName.namespaceIndex == '\0')) {
              local_58[2] = (pUVar21->nodeId).identifier.string.data;
              sVar25 = (pUVar21->nodeId).identifier.string.length;
              *puVar24 = *(undefined8 *)&pUVar21->nodeId;
              puVar24[1] = sVar25;
              UStack_a0.identifier.string.length = 0;
              UStack_a0.identifier.string.data = (UA_Byte *)0x0;
              value.serverPicoseconds = 0;
              value._90_6_ = 0;
              UStack_a0.namespaceIndex = 0;
              UStack_a0._2_2_ = 0;
              UStack_a0.identifierType = UA_NODEIDTYPE_NUMERIC;
              Service_AddNodes_single
                        (server,local_38,(UA_AddNodesItem *)&stack0xfffffffffffffd28,
                         (UA_AddNodesResult *)&value.serverPicoseconds,pUVar18);
              UVar20 = value._88_4_;
              if (value._88_4_ == 0) {
                UVar20 = copyChildNodesToNode(server,local_38,(UA_NodeId *)vn,&UStack_a0,pUVar18);
                if ((pUVar18 != (UA_InstantiationCallback *)0x0) && (UVar20 == 0)) {
                  UVar15.identifier.string.length = UStack_a0.identifier.string.length;
                  UVar15.namespaceIndex = UStack_a0.namespaceIndex;
                  UVar15._2_2_ = UStack_a0._2_2_;
                  UVar15.identifierType = UStack_a0.identifierType;
                  UVar15.identifier.string.data = UStack_a0.identifier.string.data;
                  (*pUVar18->method)(UVar15,vn->nodeId,pUVar18->handle);
                }
                UA_NodeId_deleteMembers(&UStack_a0);
              }
            }
            if ((((ulong)auStack_108 & 1) != 0) && ((int)value.value.type == 0)) {
              UA_deleteMembers(&value,UA_TYPES + 0x17);
            }
          }
        }
      }
    }
    else {
      if (iVar1 != 4) goto LAB_0012769d;
      mandatoryId.identifier.string.length = (size_t)(local_40->identifier).string.data;
      uVar6 = local_40->namespaceIndex;
      uVar7 = *(undefined2 *)&local_40->field_0x2;
      uVar8 = local_40->identifierType;
      sVar25 = (local_40->identifier).string.length;
      mandatoryId._0_4_ = SUB84(sVar25,0);
      mandatoryId.identifierType = (UA_NodeIdType)(sVar25 >> 0x20);
      mandatoryId.identifier.string.data = (UA_Byte *)*puVar24;
      UStack_2d8 = uVar6;
      uStack_2d6 = uVar7;
      UStack_2d4 = uVar8;
      UVar20 = addReference(server,local_38,(UA_AddReferencesItem *)&stack0xfffffffffffffd28);
    }
  }
  else {
    UVar20 = 0;
    if (iVar1 - 1U < 2) {
      UVar19 = UA_NodeId_equal(pUVar17,&local_78);
      if (!UVar19) {
        UVar20 = copyChildNodesToNode(server,local_38,pUVar17,&local_78,local_48);
      }
    }
    p = (UA_DataValue *)&local_78;
LAB_001278c0:
    UA_NodeId_deleteMembers((UA_NodeId *)p);
  }
  if (UVar20 != 0) goto LAB_00127dcc;
LAB_0012769d:
  pUVar22 = local_88 + 1;
  goto LAB_001275d5;
}

Assistant:

static UA_StatusCode
copyChildNodesToNode(UA_Server* server, UA_Session* session,
                     const UA_NodeId* sourceNodeId, const UA_NodeId* destinationNodeId,
                     UA_InstantiationCallback* instantiationCallback) {
    /* Browse to get all children */
    UA_BrowseDescription bd;
    UA_BrowseDescription_init(&bd);
    bd.nodeId = *sourceNodeId;
    bd.referenceTypeId = UA_NODEID_NUMERIC(0, UA_NS0ID_AGGREGATES);
    bd.includeSubtypes = true;
    bd.browseDirection = UA_BROWSEDIRECTION_FORWARD;
    bd.nodeClassMask = UA_NODECLASS_OBJECT | UA_NODECLASS_VARIABLE | UA_NODECLASS_METHOD;
    bd.resultMask = UA_BROWSERESULTMASK_REFERENCETYPEID | UA_BROWSERESULTMASK_NODECLASS |
        UA_BROWSERESULTMASK_BROWSENAME;

    UA_BrowseResult br;
    UA_BrowseResult_init(&br);
    Service_Browse_single(server, session, NULL, &bd, 0, &br);
    if(br.statusCode != UA_STATUSCODE_GOOD)
        return br.statusCode;

    /* Copy all children */
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_NodeId existingChild = UA_NODEID_NULL;
    for(size_t i = 0; i < br.referencesSize; ++i) {
        UA_ReferenceDescription *rd = &br.references[i];

        /* Is the child mandatory? If not, skip */
        if(!mandatoryChild(server, session, &rd->nodeId.nodeId))
            continue;

        /* TODO: If a child is optional, check whether optional children that
         * were manually added fit the constraints. */

        /* Check for deduplication */
        retval = instanceFindAggregateByBrowsename(server, session, destinationNodeId,
                                                   &rd->browseName, &existingChild);
        if(retval != UA_STATUSCODE_GOOD)
            break;

        if(UA_NodeId_equal(&UA_NODEID_NULL, &existingChild)) {
            /* New node in child */
            if(rd->nodeClass == UA_NODECLASS_METHOD) {
                /* add a reference to the method in the objecttype */
                UA_AddReferencesItem newItem;
                UA_AddReferencesItem_init(&newItem);
                newItem.sourceNodeId = *destinationNodeId;
                newItem.referenceTypeId = rd->referenceTypeId;
                newItem.isForward = true;
                newItem.targetNodeId = rd->nodeId;
                newItem.targetNodeClass = UA_NODECLASS_METHOD;
                retval = addReference(server, session, &newItem);
            } else if(rd->nodeClass == UA_NODECLASS_VARIABLE)
                retval = copyExistingVariable(server, session, &rd->nodeId.nodeId,
                                              &rd->referenceTypeId, destinationNodeId,
                                              instantiationCallback);
            else if(rd->nodeClass == UA_NODECLASS_OBJECT)
                retval = copyExistingObject(server, session, &rd->nodeId.nodeId,
                                            &rd->referenceTypeId, destinationNodeId,
                                            instantiationCallback);
        } else {
            /* Preexistent node in child
             * General strategy if we meet an already existing node:
             * - Preexistent variable contents always 'win' overwriting anything
             *   supertypes would instantiate
             * - Always copy contents of template *into* existant node (merge
             *   contents of e.g. Folders like ParameterSet) */
            if(rd->nodeClass == UA_NODECLASS_METHOD) {
                /* Do nothing, existent method wins */
            } else if(rd->nodeClass == UA_NODECLASS_VARIABLE ||
                      rd->nodeClass == UA_NODECLASS_OBJECT) {
                if(!UA_NodeId_equal(&rd->nodeId.nodeId, &existingChild))
                    retval = copyChildNodesToNode(server, session, &rd->nodeId.nodeId,
                                                  &existingChild, instantiationCallback);
            }
            UA_NodeId_deleteMembers(&existingChild);
        }
        if(retval != UA_STATUSCODE_GOOD)
            break;
    }
    UA_BrowseResult_deleteMembers(&br);
    return retval;
}